

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaVCheckCVCSimpleType
              (xmlSchemaAbstractCtxtPtr actxt,xmlNodePtr node,xmlSchemaTypePtr type,xmlChar *value,
              xmlSchemaValPtr *retVal,int fireErrors,int normalize,int isNormalized)

{
  xmlSchemaTypePtr *ppxVar1;
  xmlSchemaTypeType xVar2;
  uint uVar3;
  xmlGenericErrorFunc p_Var4;
  long lVar5;
  int iVar6;
  int iVar7;
  xmlSchemaTypePtr pxVar8;
  xmlGenericErrorFunc *pp_Var9;
  void **ppvVar10;
  ulong uVar11;
  xmlChar *pxVar12;
  xmlSchemaValPtr *ppxVar13;
  xmlChar *pxVar14;
  xmlSchemaTypePtr item;
  xmlSchemaValPtr *ppxVar15;
  char *pcVar16;
  xmlNodePtr node_00;
  xmlSchemaValPtr *ppxVar17;
  xmlParserErrors error;
  xmlSchemaValPtr *value_00;
  xmlSchemaPtr schema;
  xmlSchemaValidCtxtPtr vctxt;
  char *pcVar18;
  uint fireErrors_00;
  undefined4 in_register_0000008c;
  undefined8 uVar19;
  xmlSchemaValPtr pxVar20;
  unsigned_long length;
  xmlSchemaTypeLinkPtr pxVar21;
  long lVar22;
  byte bVar23;
  xmlSchemaValPtr val;
  uint local_7c;
  xmlSchemaTypePtr local_78;
  undefined8 local_70;
  xmlSchemaValPtr curVal;
  xmlSchemaValPtr *local_60;
  undefined8 local_58;
  xmlSchemaValPtr *local_50;
  xmlSchemaTypePtr local_48;
  xmlSchemaValPtr local_40;
  xmlSchemaValPtr *local_38;
  
  uVar19 = CONCAT44(in_register_0000008c,fireErrors);
  val = (xmlSchemaValPtr)0x0;
  pcVar18 = (char *)retVal;
  local_70 = uVar19;
  local_38 = retVal;
  if (retVal == (xmlSchemaValPtr *)0x0) {
    bVar23 = (*(byte *)((long)&type->flags + 2) & 0x20) >> 5;
  }
  else {
    bVar23 = 1;
    if (*retVal != (xmlSchemaValPtr)0x0) {
      xmlSchemaFreeValue(*retVal);
      *retVal = (xmlSchemaValPtr)0x0;
    }
  }
  fireErrors_00 = (uint)uVar19;
  local_7c = (uint)bVar23;
  value_00 = (xmlSchemaValPtr *)0x1f258f;
  if (value != (xmlChar *)0x0) {
    value_00 = (xmlSchemaValPtr *)value;
  }
  xVar2 = type->type;
  if (((xVar2 == XML_SCHEMA_TYPE_BASIC) && (type->builtInType == 0x2e)) ||
     (uVar3 = type->flags, (uVar3 >> 8 & 1) != 0)) {
    pxVar8 = type;
    if ((isNormalized == 0) && ((normalize != 0 || ((type->flags & 0x10000000) != 0)))) {
      ppxVar15 = (xmlSchemaValPtr *)xmlSchemaNormalizeValue(type,(xmlChar *)value_00);
      if (ppxVar15 != (xmlSchemaValPtr *)0x0) {
        value_00 = ppxVar15;
      }
      xVar2 = type->type;
    }
    else {
      ppxVar15 = (xmlSchemaValPtr *)0x0;
    }
    while (xVar2 != XML_SCHEMA_TYPE_BASIC) {
      pxVar8 = pxVar8->baseType;
      if (pxVar8 == (xmlSchemaTypePtr)0x0) {
        pcVar16 = "could not get the built-in type";
        goto LAB_001ab51c;
      }
      xVar2 = pxVar8->type;
    }
    if (actxt->type != 1) {
      if (actxt->type == 2) {
        if (pxVar8->builtInType != 0x15) {
          if (pxVar8->builtInType != 0x1c) goto LAB_001ab06c;
          schema = (xmlSchemaPtr)actxt[2].dummy;
          node_00 = (xmlNodePtr)0x0;
          vctxt = (xmlSchemaValidCtxtPtr)actxt;
          goto LAB_001ab02e;
        }
        curVal = (xmlSchemaValPtr)0x0;
        iVar6 = xmlValidateQName((xmlChar *)value_00,1);
        if (iVar6 == 0) {
          local_78 = type;
          ppxVar13 = (xmlSchemaValPtr *)xmlSchemaCollapseString((xmlChar *)value_00);
          ppxVar17 = ppxVar13;
          if (ppxVar13 == (xmlSchemaValPtr *)0x0) {
            ppxVar17 = value_00;
          }
          pxVar12 = xmlSplitQName2((xmlChar *)ppxVar17,(xmlChar **)&curVal);
          (*xmlFree)(ppxVar13);
          if (pxVar12 == (xmlChar *)0x0) {
            pxVar12 = xmlStrdup((xmlChar *)value_00);
          }
          pxVar14 = xmlSchemaLookupNamespace((xmlSchemaValidCtxtPtr)actxt,(xmlChar *)curVal);
          if ((curVal == (xmlSchemaValPtr)0x0) || ((*xmlFree)(curVal), pxVar14 != (xmlChar *)0x0)) {
            if (local_7c == 0) {
              (*xmlFree)(pxVar12);
            }
            else {
              if (pxVar14 == (xmlChar *)0x0) {
                iVar7 = 0;
                val = xmlSchemaNewQNameValue((xmlChar *)0x0,pxVar12);
                type = local_78;
                goto LAB_001ab211;
              }
              pxVar14 = xmlStrdup(pxVar14);
              val = xmlSchemaNewQNameValue(pxVar14,pxVar12);
            }
            iVar7 = 0;
            type = local_78;
          }
          else {
            item = xmlSchemaGetBuiltInType(XML_SCHEMAS_QNAME);
            pcVar18 = "The QName value \'%s\' has no corresponding namespace declaration in scope";
            iVar7 = 0x720;
            ppxVar17 = value_00;
            xmlSchemaCustomErr4(actxt,XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1,(xmlNodePtr)0x0,
                                (xmlSchemaBasicItemPtr)item,
                                "The QName value \'%s\' has no corresponding namespace declaration in scope"
                                ,(xmlChar *)value_00,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
            fireErrors_00 = (uint)ppxVar17;
            type = local_78;
            if (pxVar12 != (xmlChar *)0x0) {
              (*xmlFree)(pxVar12);
              type = local_78;
            }
          }
        }
        else {
          iVar7 = 0x720;
          if (iVar6 == -1) {
            xmlSchemaInternalErr2
                      (actxt,"xmlSchemaValidateQName","calling xmlValidateQName()",(xmlChar *)0x0,
                       (xmlChar *)pcVar18);
            iVar7 = -1;
          }
        }
        goto LAB_001ab211;
      }
      pp_Var9 = __xmlGenericError();
      p_Var4 = *pp_Var9;
      ppvVar10 = __xmlGenericErrorContext();
      (*p_Var4)(*ppvVar10,"Unimplemented block at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/xmlschemas.c"
                ,0x6109);
LAB_001ab527:
      if (ppxVar15 != (xmlSchemaValPtr *)0x0) {
        (*xmlFree)(ppxVar15);
      }
LAB_001ab538:
      error = ~XML_ERR_OK;
      goto LAB_001ab542;
    }
    if (pxVar8->builtInType != 0x1c) {
LAB_001ab06c:
      if (local_7c == 0) {
        ppxVar17 = (xmlSchemaValPtr *)0x0;
      }
      else {
        ppxVar17 = &val;
      }
      iVar7 = xmlSchemaValPredefTypeNodeNoNorm(pxVar8,(xmlChar *)value_00,ppxVar17,node);
      goto LAB_001ab211;
    }
    schema = *(xmlSchemaPtr *)(actxt + 4);
    vctxt = (xmlSchemaValidCtxtPtr)0x0;
    node_00 = node;
LAB_001ab02e:
    pcVar18 = (char *)&val;
    fireErrors_00 = local_7c;
    iVar7 = xmlSchemaValidateNotation
                      (vctxt,schema,node_00,(xmlChar *)value_00,(xmlSchemaValPtr *)pcVar18,local_7c)
    ;
LAB_001ab211:
    if (iVar7 == 0) {
      error = XML_ERR_OK;
      if ((type->flags & 0x8000000) != 0) {
        iVar7 = xmlSchemaValidateFacets
                          (actxt,node,type,pxVar8->builtInType,(xmlChar *)value_00,val,0,
                           (int)local_70);
        if (iVar7 != 0) {
          if (iVar7 < 0) {
            pcVar16 = "validating facets of atomic simple type";
            pcVar18 = (char *)value_00;
            goto LAB_001ab51c;
          }
          error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2 - ((type->flags & 0x40) == 0);
        }
      }
    }
    else {
      if (iVar7 < 0) {
        pcVar16 = "validating against a built-in type";
LAB_001ab51c:
        xmlSchemaInternalErr2
                  (actxt,"xmlSchemaVCheckCVCSimpleType",pcVar16,(xmlChar *)0x0,(xmlChar *)pcVar18);
        goto LAB_001ab527;
      }
      error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2 - ((type->flags & 0x40) == 0);
      if ((int)local_70 != 0) goto LAB_001ab408;
    }
    goto LAB_001ab418;
  }
  if ((uVar3 & 0x40) != 0) {
    curVal = (xmlSchemaValPtr)0x0;
    if (isNormalized == 0) {
      if ((uVar3 & 0x10000000) == 0 && normalize == 0) {
        local_58 = CONCAT71((uint7)(uint3)(xVar2 >> 8),1);
        goto LAB_001aafeb;
      }
      local_60 = (xmlSchemaValPtr *)xmlSchemaNormalizeValue(type,(xmlChar *)value_00);
      if (local_60 != (xmlSchemaValPtr *)0x0) {
        value_00 = local_60;
      }
      local_58 = 0;
    }
    else {
      local_58 = 0;
LAB_001aafeb:
      local_60 = (xmlSchemaValPtr *)0x0;
    }
    local_48 = type->subtypes;
    length = 0;
    local_40 = (xmlSchemaValPtr)0x0;
    local_78 = type;
    local_50 = value_00;
    do {
      while ((uVar11 = (ulong)*(byte *)value_00, uVar11 < 0x21 &&
             ((0x100002600U >> (uVar11 & 0x3f) & 1) != 0))) {
        value_00 = (xmlSchemaValPtr *)((long)value_00 + 1);
      }
      lVar22 = 0;
      while ((0x20 < (byte)uVar11 || ((0x100002601U >> (uVar11 & 0x3f) & 1) == 0))) {
        lVar5 = lVar22 + 1;
        lVar22 = lVar22 + 1;
        uVar11 = (ulong)*(byte *)((long)value_00 + lVar5);
      }
      if (lVar22 == 0) break;
      pxVar12 = xmlStrndup((xmlChar *)value_00,(int)lVar22);
      if (local_7c == 0) {
        pcVar18 = (char *)0x0;
      }
      else {
        pcVar18 = (char *)&curVal;
      }
      fireErrors_00 = (uint)local_70;
      iVar7 = xmlSchemaVCheckCVCSimpleType
                        (actxt,node,local_48,pxVar12,(xmlSchemaValPtr *)pcVar18,fireErrors_00,0,1);
      if (pxVar12 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar12);
      }
      if (curVal != (xmlSchemaValPtr)0x0) {
        if (val == (xmlSchemaValPtr)0x0) {
          val = curVal;
          local_40 = curVal;
        }
        else {
          xmlSchemaValueAppend(local_40,curVal);
          local_40 = curVal;
        }
        curVal = (xmlSchemaValPtr)0x0;
      }
      if (iVar7 != 0) {
        type = local_78;
        value_00 = local_50;
        if (-1 < iVar7) goto LAB_001ab30b;
        pcVar16 = "validating an item of list simple type";
        ppxVar15 = local_60;
        goto LAB_001ab51c;
      }
      value_00 = (xmlSchemaValPtr *)((long)value_00 + lVar22);
      length = length + 1;
    } while (*(byte *)value_00 != 0);
    value_00 = local_50;
    type = local_78;
    error = XML_ERR_OK;
    ppxVar15 = local_60;
    if ((local_78->flags & 0x8000000) != 0) {
      error = XML_ERR_OK;
      pcVar18 = (char *)local_50;
      pxVar20 = val;
      iVar7 = xmlSchemaValidateFacets
                        (actxt,node,local_78,XML_SCHEMAS_UNKNOWN,(xmlChar *)local_50,val,length,
                         (int)local_70);
      fireErrors_00 = (uint)pxVar20;
      ppxVar15 = local_60;
      if (iVar7 == 0) goto LAB_001ab418;
      if (-1 < iVar7) {
LAB_001ab30b:
        ppxVar15 = local_60;
        if ((int)local_70 != 0) {
          if (((char)local_58 != '\0') &&
             (ppxVar15 = (xmlSchemaValPtr *)xmlSchemaNormalizeValue(type,(xmlChar *)value_00),
             ppxVar15 != (xmlSchemaValPtr *)0x0)) {
            value_00 = ppxVar15;
          }
          error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
          goto LAB_001ab408;
        }
        error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
        goto LAB_001ab418;
      }
      pcVar16 = "validating facets of list simple type";
      goto LAB_001ab51c;
    }
    goto LAB_001ab418;
  }
  pxVar8 = type;
  if ((char)uVar3 < '\0') {
    do {
      if (pxVar8->type != XML_SCHEMA_TYPE_SIMPLE) break;
      pxVar21 = pxVar8->memberTypes;
      if (pxVar21 != (xmlSchemaTypeLinkPtr)0x0) {
        goto LAB_001ab39c;
      }
      ppxVar1 = &pxVar8->baseType;
      pxVar8 = *ppxVar1;
    } while (*ppxVar1 != (xmlSchemaTypePtr)0x0);
    pcVar16 = "union simple type has no member types";
LAB_001aaf38:
    xmlSchemaInternalErr2
              (actxt,"xmlSchemaVCheckCVCSimpleType",pcVar16,(xmlChar *)0x0,(xmlChar *)pcVar18);
    goto LAB_001ab538;
  }
  goto LAB_001ab57a;
  while (pxVar21 = pxVar21->next, pxVar21 != (_xmlSchemaTypeLink *)0x0) {
LAB_001ab39c:
    pcVar18 = (char *)&val;
    if (local_7c == 0) {
      pcVar18 = (char *)(xmlSchemaValPtr *)0x0;
    }
    fireErrors_00 = 0;
    iVar7 = xmlSchemaVCheckCVCSimpleType
                      (actxt,node,pxVar21->type,(xmlChar *)value_00,(xmlSchemaValPtr *)pcVar18,0,1,0
                      );
    if (iVar7 < 1) {
      if (iVar7 != 0) {
        pcVar16 = "validating members of union simple type";
        goto LAB_001aaf38;
      }
      if (((uint)type->flags >> 0x1b & 1) == 0) goto LAB_001ab57a;
      error = XML_ERR_OK;
      if ((isNormalized == 0) && ((type->flags & 0x10000000U) != 0 || normalize != 0)) {
        ppxVar15 = (xmlSchemaValPtr *)xmlSchemaNormalizeValue(pxVar21->type,(xmlChar *)value_00);
        if (ppxVar15 != (xmlSchemaValPtr *)0x0) {
          value_00 = ppxVar15;
        }
      }
      else {
        ppxVar15 = (xmlSchemaValPtr *)0x0;
      }
      pcVar18 = (char *)value_00;
      pxVar20 = val;
      iVar7 = xmlSchemaValidateFacets
                        (actxt,node,type,XML_SCHEMAS_UNKNOWN,(xmlChar *)value_00,val,0,(int)local_70
                        );
      fireErrors_00 = (uint)pxVar20;
      if (iVar7 == 0) goto LAB_001ab418;
      if (-1 < iVar7) goto LAB_001ab3ef;
      pcVar16 = "validating facets of union simple type";
      goto LAB_001ab51c;
    }
  }
  ppxVar15 = (xmlSchemaValPtr *)0x0;
LAB_001ab3ef:
  if ((int)local_70 == 0) {
    error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_3;
    goto LAB_001ab418;
  }
  error = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_3;
LAB_001ab408:
  xmlSchemaSimpleTypeErr(actxt,error,node,(xmlChar *)value_00,type,fireErrors_00);
LAB_001ab418:
  if (ppxVar15 != (xmlSchemaValPtr *)0x0) {
    (*xmlFree)(ppxVar15);
  }
  if (error != XML_ERR_OK) goto LAB_001ab542;
LAB_001ab57a:
  if (local_38 != (xmlSchemaValPtr *)0x0) {
    *local_38 = val;
    return 0;
  }
  error = XML_ERR_OK;
LAB_001ab542:
  if (val != (xmlSchemaValPtr)0x0) {
    xmlSchemaFreeValue(val);
  }
  return error;
}

Assistant:

static int
xmlSchemaVCheckCVCSimpleType(xmlSchemaAbstractCtxtPtr actxt,
			     xmlNodePtr node,
			     xmlSchemaTypePtr type,
			     const xmlChar *value,
			     xmlSchemaValPtr *retVal,
			     int fireErrors,
			     int normalize,
			     int isNormalized)
{
    int ret = 0, valNeeded = (retVal) ? 1 : 0;
    xmlSchemaValPtr val = NULL;
    /* xmlSchemaWhitespaceValueType ws; */
    xmlChar *normValue = NULL;

#define NORMALIZE(atype) \
    if ((! isNormalized) && \
    (normalize || (type->flags & XML_SCHEMAS_TYPE_NORMVALUENEEDED))) { \
	normValue = xmlSchemaNormalizeValue(atype, value); \
	if (normValue != NULL) \
	    value = normValue; \
	isNormalized = 1; \
    }

    if ((retVal != NULL) && (*retVal != NULL)) {
	xmlSchemaFreeValue(*retVal);
	*retVal = NULL;
    }
    /*
    * 3.14.4 Simple Type Definition Validation Rules
    * Validation Rule: String Valid
    */
    /*
    * 1 It is schema-valid with respect to that definition as defined
    * by Datatype Valid in [XML Schemas: Datatypes].
    */
    /*
    * 2.1 If The definition is ENTITY or is validly derived from ENTITY given
    * the empty set, as defined in Type Derivation OK (Simple) ($3.14.6), then
    * the string must be a `declared entity name`.
    */
    /*
    * 2.2 If The definition is ENTITIES or is validly derived from ENTITIES
    * given the empty set, as defined in Type Derivation OK (Simple) ($3.14.6),
    * then every whitespace-delimited substring of the string must be a `declared
    * entity name`.
    */
    /*
    * 2.3 otherwise no further condition applies.
    */
    if ((! valNeeded) && (type->flags & XML_SCHEMAS_TYPE_FACETSNEEDVALUE))
	valNeeded = 1;
    if (value == NULL)
	value = BAD_CAST "";
    if (WXS_IS_ANY_SIMPLE_TYPE(type) || WXS_IS_ATOMIC(type)) {
	xmlSchemaTypePtr biType; /* The built-in type. */
	/*
	* SPEC (1.2.1) "if {variety} is `atomic` then the string must `match`
	* a literal in the `lexical space` of {base type definition}"
	*/
	/*
	* Whitespace-normalize.
	*/
	NORMALIZE(type);
	if (type->type != XML_SCHEMA_TYPE_BASIC) {
	    /*
	    * Get the built-in type.
	    */
	    biType = type->baseType;
	    while ((biType != NULL) &&
		(biType->type != XML_SCHEMA_TYPE_BASIC))
		biType = biType->baseType;

	    if (biType == NULL) {
		AERROR_INT("xmlSchemaVCheckCVCSimpleType",
		    "could not get the built-in type");
		goto internal_error;
	    }
	} else
	    biType = type;
	/*
	* NOTATIONs need to be processed here, since they need
	* to lookup in the hashtable of NOTATION declarations of the schema.
	*/
	if (actxt->type == XML_SCHEMA_CTXT_VALIDATOR) {
	    switch (biType->builtInType) {
		case XML_SCHEMAS_NOTATION:
		    ret = xmlSchemaValidateNotation(
			(xmlSchemaValidCtxtPtr) actxt,
			((xmlSchemaValidCtxtPtr) actxt)->schema,
			NULL, value, &val, valNeeded);
		    break;
		case XML_SCHEMAS_QNAME:
		    ret = xmlSchemaValidateQName((xmlSchemaValidCtxtPtr) actxt,
			value, &val, valNeeded);
		    break;
		default:
		    /* ws = xmlSchemaGetWhiteSpaceFacetValue(type); */
		    if (valNeeded)
			ret = xmlSchemaValPredefTypeNodeNoNorm(biType,
			    value, &val, node);
		    else
			ret = xmlSchemaValPredefTypeNodeNoNorm(biType,
			    value, NULL, node);
		    break;
	    }
	} else if (actxt->type == XML_SCHEMA_CTXT_PARSER) {
	    switch (biType->builtInType) {
		case XML_SCHEMAS_NOTATION:
		    ret = xmlSchemaValidateNotation(NULL,
			((xmlSchemaParserCtxtPtr) actxt)->schema, node,
			value, &val, valNeeded);
		    break;
		default:
		    /* ws = xmlSchemaGetWhiteSpaceFacetValue(type); */
		    if (valNeeded)
			ret = xmlSchemaValPredefTypeNodeNoNorm(biType,
			    value, &val, node);
		    else
			ret = xmlSchemaValPredefTypeNodeNoNorm(biType,
			    value, NULL, node);
		    break;
	    }
	} else {
	    /*
	    * Validation via a public API is not implemented yet.
	    */
	    TODO
	    goto internal_error;
	}
	if (ret != 0) {
	    if (ret < 0) {
		AERROR_INT("xmlSchemaVCheckCVCSimpleType",
		    "validating against a built-in type");
		goto internal_error;
	    }
	    if (WXS_IS_LIST(type))
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
	    else
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1;
	}
	if ((ret == 0) && (type->flags & XML_SCHEMAS_TYPE_HAS_FACETS)) {
	    /*
	    * Check facets.
	    */
	    ret = xmlSchemaValidateFacets(actxt, node, type,
		(xmlSchemaValType) biType->builtInType, value, val,
		0, fireErrors);
	    if (ret != 0) {
		if (ret < 0) {
		    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
			"validating facets of atomic simple type");
		    goto internal_error;
		}
		if (WXS_IS_LIST(type))
		    ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
		else
		    ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1;
	    }
	}
	else if (fireErrors && (ret > 0))
	    xmlSchemaSimpleTypeErr(actxt, ret, node, value, type, 1);
    } else if (WXS_IS_LIST(type)) {

	xmlSchemaTypePtr itemType;
	const xmlChar *cur, *end;
	xmlChar *tmpValue = NULL;
	unsigned long len = 0;
	xmlSchemaValPtr prevVal = NULL, curVal = NULL;
	/* 1.2.2 if {variety} is `list` then the string must be a sequence
	* of white space separated tokens, each of which `match`es a literal
	* in the `lexical space` of {item type definition}
	*/
	/*
	* Note that XML_SCHEMAS_TYPE_NORMVALUENEEDED will be set if
	* the list type has an enum or pattern facet.
	*/
	NORMALIZE(type);
	/*
	* VAL TODO: Optimize validation of empty values.
	* VAL TODO: We do not have computed values for lists.
	*/
	itemType = WXS_LIST_ITEMTYPE(type);
	cur = value;
	do {
	    while (IS_BLANK_CH(*cur))
		cur++;
	    end = cur;
	    while ((*end != 0) && (!(IS_BLANK_CH(*end))))
		end++;
	    if (end == cur)
		break;
	    tmpValue = xmlStrndup(cur, end - cur);
	    len++;

	    if (valNeeded)
		ret = xmlSchemaVCheckCVCSimpleType(actxt, node, itemType,
		    tmpValue, &curVal, fireErrors, 0, 1);
	    else
		ret = xmlSchemaVCheckCVCSimpleType(actxt, node, itemType,
		    tmpValue, NULL, fireErrors, 0, 1);
	    FREE_AND_NULL(tmpValue);
	    if (curVal != NULL) {
		/*
		* Add to list of computed values.
		*/
		if (val == NULL)
		    val = curVal;
		else
		    xmlSchemaValueAppend(prevVal, curVal);
		prevVal = curVal;
		curVal = NULL;
	    }
	    if (ret != 0) {
		if (ret < 0) {
		    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
			"validating an item of list simple type");
		    goto internal_error;
		}
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
		break;
	    }
	    cur = end;
	} while (*cur != 0);
	FREE_AND_NULL(tmpValue);
	if ((ret == 0) && (type->flags & XML_SCHEMAS_TYPE_HAS_FACETS)) {
	    /*
	    * Apply facets (pattern, enumeration).
	    */
	    ret = xmlSchemaValidateFacets(actxt, node, type,
		XML_SCHEMAS_UNKNOWN, value, val,
		len, fireErrors);
	    if (ret != 0) {
		if (ret < 0) {
		    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
			"validating facets of list simple type");
		    goto internal_error;
		}
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
	    }
	}
	if (fireErrors && (ret > 0)) {
	    /*
	    * Report the normalized value.
	    */
	    normalize = 1;
	    NORMALIZE(type);
	    xmlSchemaSimpleTypeErr(actxt, ret, node, value, type, 1);
	}
    } else if (WXS_IS_UNION(type)) {
	xmlSchemaTypeLinkPtr memberLink;
	/*
	* TODO: For all datatypes `derived` by `union`  whiteSpace does
	* not apply directly; however, the normalization behavior of `union`
	* types is controlled by the value of whiteSpace on that one of the
	* `memberTypes` against which the `union` is successfully validated.
	*
	* This means that the value is normalized by the first validating
	* member type, then the facets of the union type are applied. This
	* needs changing of the value!
	*/

	/*
	* 1.2.3 if {variety} is `union` then the string must `match` a
	* literal in the `lexical space` of at least one member of
	* {member type definitions}
	*/
	memberLink = xmlSchemaGetUnionSimpleTypeMemberTypes(type);
	if (memberLink == NULL) {
	    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
		"union simple type has no member types");
	    goto internal_error;
	}
	/*
	* Always normalize union type values, since we currently
	* cannot store the whitespace information with the value
	* itself; otherwise a later value-comparison would be
	* not possible.
	*/
	while (memberLink != NULL) {
	    if (valNeeded)
		ret = xmlSchemaVCheckCVCSimpleType(actxt, node,
		    memberLink->type, value, &val, 0, 1, 0);
	    else
		ret = xmlSchemaVCheckCVCSimpleType(actxt, node,
		    memberLink->type, value, NULL, 0, 1, 0);
	    if (ret <= 0)
		break;
	    memberLink = memberLink->next;
	}
	if (ret != 0) {
	    if (ret < 0) {
		AERROR_INT("xmlSchemaVCheckCVCSimpleType",
		    "validating members of union simple type");
		goto internal_error;
	    }
	    ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_3;
	}
	/*
	* Apply facets (pattern, enumeration).
	*/
	if ((ret == 0) && (type->flags & XML_SCHEMAS_TYPE_HAS_FACETS)) {
	    /*
	    * The normalization behavior of `union` types is controlled by
	    * the value of whiteSpace on that one of the `memberTypes`
	    * against which the `union` is successfully validated.
	    */
	    NORMALIZE(memberLink->type);
	    ret = xmlSchemaValidateFacets(actxt, node, type,
		XML_SCHEMAS_UNKNOWN, value, val,
		0, fireErrors);
	    if (ret != 0) {
		if (ret < 0) {
		    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
			"validating facets of union simple type");
		    goto internal_error;
		}
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_3;
	    }
	}
	if (fireErrors && (ret > 0))
	    xmlSchemaSimpleTypeErr(actxt, ret, node, value, type, 1);
    }

    if (normValue != NULL)
	xmlFree(normValue);
    if (ret == 0) {
	if (retVal != NULL)
	    *retVal = val;
	else if (val != NULL)
	    xmlSchemaFreeValue(val);
    } else if (val != NULL)
	xmlSchemaFreeValue(val);
    return (ret);
internal_error:
    if (normValue != NULL)
	xmlFree(normValue);
    if (val != NULL)
	xmlSchemaFreeValue(val);
    return (-1);
}